

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderRequire(Fts3SegReader *pReader,char *pFrom,int nByte)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int rc;
  undefined7 in_stack_ffffffffffffffe0;
  bool bVar1;
  undefined4 local_18;
  
  local_18 = 0;
  while( true ) {
    bVar1 = false;
    if ((*(long *)(in_RDI + 0x38) != 0) && (bVar1 = false, local_18 == 0)) {
      bVar1 = (long)*(int *)(in_RDI + 0x34) < (in_RSI - *(long *)(in_RDI + 0x28)) + (long)in_EDX;
    }
    if (bVar1 == false) break;
    local_18 = fts3SegReaderIncrRead((Fts3SegReader *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
  }
  return local_18;
}

Assistant:

static int fts3SegReaderRequire(Fts3SegReader *pReader, char *pFrom, int nByte){
  int rc = SQLITE_OK;
  assert( !pReader->pBlob
       || (pFrom>=pReader->aNode && pFrom<&pReader->aNode[pReader->nNode])
  );
  while( pReader->pBlob && rc==SQLITE_OK
     &&  (pFrom - pReader->aNode + nByte)>pReader->nPopulate
  ){
    rc = fts3SegReaderIncrRead(pReader);
  }
  return rc;
}